

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

uint m68k_is_valid_instruction(uint instruction,uint cpu_type)

{
  _func_void *p_Var1;
  uint uVar2;
  int iVar3;
  int iVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  
  if (g_initialized == '\0') {
    build_opcode_table();
    g_initialized = '\x01';
  }
  p_Var1 = g_instruction_table[(ulong)instruction & 0xffff];
  uVar2 = 0;
  if (p_Var1 == d68000_illegal) {
    return 0;
  }
  iVar3 = (int)p_Var1;
  iVar6 = (int)((ulong)p_Var1 >> 0x20);
  switch(cpu_type) {
  case 1:
    if (p_Var1 == d68010_rtd) {
      return 0;
    }
    if (p_Var1 == d68010_moves_32) {
      return 0;
    }
    if (p_Var1 == d68010_moves_16) {
      return 0;
    }
    if (p_Var1 == d68010_moves_8) {
      return 0;
    }
    if (p_Var1 == d68010_movec) {
      return 0;
    }
    if (p_Var1 == d68010_bkpt) {
      return 0;
    }
    if (p_Var1 == d68010_move_fr_ccr) {
      return 0;
    }
    break;
  case 2:
    break;
  case 3:
  case 4:
  case 5:
  case 6:
    goto switchD_003f98d3_caseD_3;
  case 7:
  case 8:
  case 9:
    goto switchD_003f98d3_caseD_7;
  default:
    goto switchD_003f98d3_default;
  }
  auVar5._0_4_ = -(uint)(iVar3 == 0x3fb594);
  auVar5._4_4_ = -(uint)(iVar6 == 0);
  auVar5._8_4_ = -(uint)(iVar3 == 0x3fb602);
  auVar5._12_4_ = -(uint)(iVar6 == 0);
  auVar53._4_4_ = auVar5._0_4_;
  auVar53._0_4_ = auVar5._4_4_;
  auVar53._8_4_ = auVar5._12_4_;
  auVar53._12_4_ = auVar5._8_4_;
  auVar17._0_4_ = -(uint)(iVar3 == 0x3fb47f);
  auVar17._4_4_ = -(uint)(iVar6 == 0);
  auVar17._8_4_ = -(uint)(iVar3 == 0x3fb526);
  auVar17._12_4_ = -(uint)(iVar6 == 0);
  auVar56._4_4_ = auVar17._0_4_;
  auVar56._0_4_ = auVar17._4_4_;
  auVar56._8_4_ = auVar17._12_4_;
  auVar56._12_4_ = auVar17._8_4_;
  auVar5 = packssdw(auVar56 & auVar17,auVar53 & auVar5);
  auVar32._0_4_ = -(uint)(iVar3 == 0x3fb334);
  auVar32._4_4_ = -(uint)(iVar6 == 0);
  auVar32._8_4_ = -(uint)(iVar3 == 0x3fb3d8);
  auVar32._12_4_ = -(uint)(iVar6 == 0);
  auVar18._4_4_ = auVar32._0_4_;
  auVar18._0_4_ = auVar32._4_4_;
  auVar18._8_4_ = auVar32._12_4_;
  auVar18._12_4_ = auVar32._8_4_;
  auVar45._0_4_ = -(uint)(iVar3 == 0x3fb20b);
  auVar45._4_4_ = -(uint)(iVar6 == 0);
  auVar45._8_4_ = -(uint)(iVar3 == 0x3fb2c9);
  auVar45._12_4_ = -(uint)(iVar6 == 0);
  auVar8._4_4_ = auVar45._0_4_;
  auVar8._0_4_ = auVar45._4_4_;
  auVar8._8_4_ = auVar45._12_4_;
  auVar8._12_4_ = auVar45._8_4_;
  auVar56 = packssdw(auVar8 & auVar45,auVar18 & auVar32);
  auVar56 = packssdw(auVar56,auVar5);
  auVar59._0_4_ = -(uint)(iVar3 == 0x3fabe2);
  auVar59._4_4_ = -(uint)(iVar6 == 0);
  auVar59._8_4_ = -(uint)(iVar3 == 0x3faccc);
  auVar59._12_4_ = -(uint)(iVar6 == 0);
  auVar20._4_4_ = auVar59._0_4_;
  auVar20._0_4_ = auVar59._4_4_;
  auVar20._8_4_ = auVar59._12_4_;
  auVar20._12_4_ = auVar59._8_4_;
  auVar61._0_4_ = -(uint)(iVar3 == 0x3faa0c);
  auVar61._4_4_ = -(uint)(iVar6 == 0);
  auVar61._8_4_ = -(uint)(iVar3 == 0x3faaf7);
  auVar61._12_4_ = -(uint)(iVar6 == 0);
  auVar19._4_4_ = auVar61._0_4_;
  auVar19._0_4_ = auVar61._4_4_;
  auVar19._8_4_ = auVar61._12_4_;
  auVar19._12_4_ = auVar61._8_4_;
  auVar20 = packssdw(auVar19 & auVar61,auVar20 & auVar59);
  auVar63._0_4_ = -(uint)(iVar3 == 0x3fa83c);
  auVar63._4_4_ = -(uint)(iVar6 == 0);
  auVar63._8_4_ = -(uint)(iVar3 == 0x3fa921);
  auVar63._12_4_ = -(uint)(iVar6 == 0);
  auVar33._4_4_ = auVar63._0_4_;
  auVar33._0_4_ = auVar63._4_4_;
  auVar33._8_4_ = auVar63._12_4_;
  auVar33._12_4_ = auVar63._8_4_;
  auVar66._0_4_ = -(uint)(iVar3 == 0x3fa6d6);
  auVar66._4_4_ = -(uint)(iVar6 == 0);
  auVar66._8_4_ = -(uint)(iVar3 == 0x3fa757);
  auVar66._12_4_ = -(uint)(iVar6 == 0);
  auVar23._4_4_ = auVar66._0_4_;
  auVar23._0_4_ = auVar66._4_4_;
  auVar23._8_4_ = auVar66._12_4_;
  auVar23._12_4_ = auVar66._8_4_;
  auVar5 = packssdw(auVar23 & auVar66,auVar33 & auVar63);
  auVar5 = packssdw(auVar5,auVar20);
  auVar21._0_4_ = -(uint)(iVar3 == 0x3fba29);
  auVar21._4_4_ = -(uint)(iVar6 == 0);
  auVar21._8_4_ = -(uint)(iVar3 == 0x3fbab4);
  auVar21._12_4_ = -(uint)(iVar6 == 0);
  auVar9._4_4_ = auVar21._0_4_;
  auVar9._0_4_ = auVar21._4_4_;
  auVar9._8_4_ = auVar21._12_4_;
  auVar9._12_4_ = auVar21._8_4_;
  auVar34._0_4_ = -(uint)(iVar3 == 0x3fb89e);
  auVar34._4_4_ = -(uint)(iVar6 == 0);
  auVar34._8_4_ = -(uint)(iVar3 == 0x3fb94d);
  auVar34._12_4_ = -(uint)(iVar6 == 0);
  auVar22._4_4_ = auVar34._0_4_;
  auVar22._0_4_ = auVar34._4_4_;
  auVar22._8_4_ = auVar34._12_4_;
  auVar22._12_4_ = auVar34._8_4_;
  auVar23 = packssdw(auVar22 & auVar34,auVar9 & auVar21);
  auVar10._0_4_ = -(uint)(iVar3 == 0x3fb75e);
  auVar10._4_4_ = -(uint)(iVar6 == 0);
  auVar10._8_4_ = -(uint)(iVar3 == 0x3fb7d2);
  auVar10._12_4_ = -(uint)(iVar6 == 0);
  auVar35._4_4_ = auVar10._0_4_;
  auVar35._0_4_ = auVar10._4_4_;
  auVar35._8_4_ = auVar10._12_4_;
  auVar35._12_4_ = auVar10._8_4_;
  auVar46._0_4_ = -(uint)(iVar3 == 0x3fb676);
  auVar46._4_4_ = -(uint)(iVar6 == 0);
  auVar46._8_4_ = -(uint)(iVar3 == 0x3fb6ea);
  auVar46._12_4_ = -(uint)(iVar6 == 0);
  auVar11._4_4_ = auVar46._0_4_;
  auVar11._0_4_ = auVar46._4_4_;
  auVar11._8_4_ = auVar46._12_4_;
  auVar11._12_4_ = auVar46._8_4_;
  auVar20 = packssdw(auVar11 & auVar46,auVar35 & auVar10);
  auVar20 = packssdw(auVar20,auVar23);
  auVar36._0_4_ = -(uint)(iVar3 == 0x3fb0ce);
  auVar36._4_4_ = -(uint)(iVar6 == 0);
  auVar36._8_4_ = -(uint)(iVar3 == 0x3fb14d);
  auVar36._12_4_ = -(uint)(iVar6 == 0);
  auVar24._4_4_ = auVar36._0_4_;
  auVar24._0_4_ = auVar36._4_4_;
  auVar24._8_4_ = auVar36._12_4_;
  auVar24._12_4_ = auVar36._8_4_;
  auVar47._0_4_ = -(uint)(iVar3 == 0x3fafd3);
  auVar47._4_4_ = -(uint)(iVar6 == 0);
  auVar47._8_4_ = -(uint)(iVar3 == 0x3fb04f);
  auVar47._12_4_ = -(uint)(iVar6 == 0);
  auVar37._4_4_ = auVar47._0_4_;
  auVar37._0_4_ = auVar47._4_4_;
  auVar37._8_4_ = auVar47._12_4_;
  auVar37._12_4_ = auVar47._8_4_;
  auVar38 = packssdw(auVar37 & auVar47,auVar24 & auVar36);
  auVar25._0_4_ = -(uint)(iVar3 == 0x3faef4);
  auVar25._4_4_ = -(uint)(iVar6 == 0);
  auVar25._8_4_ = -(uint)(iVar3 == 0x3faf52);
  auVar25._12_4_ = -(uint)(iVar6 == 0);
  auVar48._4_4_ = auVar25._0_4_;
  auVar48._0_4_ = auVar25._4_4_;
  auVar48._8_4_ = auVar25._12_4_;
  auVar48._12_4_ = auVar25._8_4_;
  auVar60._0_4_ = -(uint)(iVar3 == 0x3fadb1);
  auVar60._4_4_ = -(uint)(iVar6 == 0);
  auVar60._8_4_ = -(uint)(iVar3 == 0x3fae96);
  auVar60._12_4_ = -(uint)(iVar6 == 0);
  auVar26._4_4_ = auVar60._0_4_;
  auVar26._0_4_ = auVar60._4_4_;
  auVar26._8_4_ = auVar60._12_4_;
  auVar26._12_4_ = auVar60._8_4_;
  auVar23 = packssdw(auVar26 & auVar60,auVar48 & auVar25);
  auVar38 = packssdw(auVar23,auVar38);
  auVar57._0_4_ = -(uint)(iVar3 == 0x3fc31e);
  auVar57._4_4_ = -(uint)(iVar6 == 0);
  auVar57._8_4_ = -(uint)(iVar3 == 0x3fc3ac);
  auVar57._12_4_ = -(uint)(iVar6 == 0);
  auVar12._4_4_ = auVar57._0_4_;
  auVar12._0_4_ = auVar57._4_4_;
  auVar12._8_4_ = auVar57._12_4_;
  auVar12._12_4_ = auVar57._8_4_;
  auVar62._0_4_ = -(uint)(iVar3 == 0x3fc232);
  auVar62._4_4_ = -(uint)(iVar6 == 0);
  auVar62._8_4_ = -(uint)(iVar3 == 0x3fc290);
  auVar62._12_4_ = -(uint)(iVar6 == 0);
  auVar39._4_4_ = auVar62._0_4_;
  auVar39._0_4_ = auVar62._4_4_;
  auVar39._8_4_ = auVar62._12_4_;
  auVar39._12_4_ = auVar62._8_4_;
  auVar40 = packssdw(auVar39 & auVar62,auVar12 & auVar57);
  auVar65._0_4_ = -(uint)(iVar3 == 0x3fc146);
  auVar65._4_4_ = -(uint)(iVar6 == 0);
  auVar65._8_4_ = -(uint)(iVar3 == 0x3fc1d2);
  auVar65._12_4_ = -(uint)(iVar6 == 0);
  auVar49._4_4_ = auVar65._0_4_;
  auVar49._0_4_ = auVar65._4_4_;
  auVar49._8_4_ = auVar65._12_4_;
  auVar49._12_4_ = auVar65._8_4_;
  auVar67._0_4_ = -(uint)(iVar3 == 0x3fbff3);
  auVar67._4_4_ = -(uint)(iVar6 == 0);
  auVar67._8_4_ = -(uint)(iVar3 == 0x3fc0ba);
  auVar67._12_4_ = -(uint)(iVar6 == 0);
  auVar13._4_4_ = auVar67._0_4_;
  auVar13._0_4_ = auVar67._4_4_;
  auVar13._8_4_ = auVar67._12_4_;
  auVar13._12_4_ = auVar67._8_4_;
  auVar23 = packssdw(auVar13 & auVar67,auVar49 & auVar65);
  auVar23 = packssdw(auVar23,auVar40);
  auVar41._0_4_ = -(uint)(iVar3 == 0x3fbf40);
  auVar41._4_4_ = -(uint)(iVar6 == 0);
  auVar41._8_4_ = -(uint)(iVar3 == 0x3fbf8b);
  auVar41._12_4_ = -(uint)(iVar6 == 0);
  auVar27._4_4_ = auVar41._0_4_;
  auVar27._0_4_ = auVar41._4_4_;
  auVar27._8_4_ = auVar41._12_4_;
  auVar27._12_4_ = auVar41._8_4_;
  auVar50._0_4_ = -(uint)(iVar3 == 0x3fbd6d);
  auVar50._4_4_ = -(uint)(iVar6 == 0);
  auVar50._8_4_ = -(uint)(iVar3 == 0x3fbe1f);
  auVar50._12_4_ = -(uint)(iVar6 == 0);
  auVar42._4_4_ = auVar50._0_4_;
  auVar42._0_4_ = auVar50._4_4_;
  auVar42._8_4_ = auVar50._12_4_;
  auVar42._12_4_ = auVar50._8_4_;
  auVar40 = packssdw(auVar42 & auVar50,auVar27 & auVar41);
  auVar51._0_4_ = -(uint)(iVar3 == 0x3fbc43);
  auVar51._4_4_ = -(uint)(iVar6 == 0);
  auVar51._8_4_ = -(uint)(iVar3 == 0x3fbcbb);
  auVar51._12_4_ = -(uint)(iVar6 == 0);
  auVar28._4_4_ = auVar51._0_4_;
  auVar28._0_4_ = auVar51._4_4_;
  auVar28._8_4_ = auVar51._12_4_;
  auVar28._12_4_ = auVar51._8_4_;
  auVar58._0_4_ = -(uint)(iVar3 == 0x3fbb31);
  auVar58._4_4_ = -(uint)(iVar6 == 0);
  auVar58._8_4_ = -(uint)(iVar3 == 0x3fbbae);
  auVar58._12_4_ = -(uint)(iVar6 == 0);
  auVar52._4_4_ = auVar58._0_4_;
  auVar52._0_4_ = auVar58._4_4_;
  auVar52._8_4_ = auVar58._12_4_;
  auVar52._12_4_ = auVar58._8_4_;
  auVar53 = packssdw(auVar52 & auVar58,auVar28 & auVar51);
  auVar40 = packssdw(auVar53,auVar40);
  auVar20 = packsswb(auVar40 | auVar5 | auVar56,auVar23 | auVar38 | auVar20);
  auVar64._0_4_ = -(uint)(iVar3 == 0x3fc635);
  auVar64._4_4_ = -(uint)(iVar6 == 0);
  auVar64._8_4_ = -(uint)(iVar3 == 0x3fc693);
  auVar64._12_4_ = -(uint)(iVar6 == 0);
  auVar38._4_4_ = auVar64._0_4_;
  auVar38._0_4_ = auVar64._4_4_;
  auVar38._8_4_ = auVar64._12_4_;
  auVar38._12_4_ = auVar64._8_4_;
  auVar68._0_4_ = -(uint)(iVar3 == 0x3fc579);
  auVar68._4_4_ = -(uint)(iVar6 == 0);
  auVar68._8_4_ = -(uint)(iVar3 == 0x3fc5d7);
  auVar68._12_4_ = -(uint)(iVar6 == 0);
  auVar14._4_4_ = auVar68._0_4_;
  auVar14._0_4_ = auVar68._4_4_;
  auVar14._8_4_ = auVar68._12_4_;
  auVar14._12_4_ = auVar68._8_4_;
  auVar5 = packssdw(auVar14 & auVar68,auVar38 & auVar64);
  auVar29._0_4_ = -(uint)(iVar3 == 0x3fc4bd);
  auVar29._4_4_ = -(uint)(iVar6 == 0);
  auVar29._8_4_ = -(uint)(iVar3 == 0x3fc51b);
  auVar29._12_4_ = -(uint)(iVar6 == 0);
  auVar40._4_4_ = auVar29._0_4_;
  auVar40._0_4_ = auVar29._4_4_;
  auVar40._8_4_ = auVar29._12_4_;
  auVar40._12_4_ = auVar29._8_4_;
  auVar43._0_4_ = -(uint)(iVar3 == 0x3fc407);
  auVar43._4_4_ = -(uint)(iVar6 == 0);
  auVar43._8_4_ = -(uint)(iVar3 == 0x3fc462);
  auVar43._12_4_ = -(uint)(iVar6 == 0);
  auVar30._4_4_ = auVar43._0_4_;
  auVar30._0_4_ = auVar43._4_4_;
  auVar30._8_4_ = auVar43._12_4_;
  auVar30._12_4_ = auVar43._8_4_;
  auVar56 = packssdw(auVar30 & auVar43,auVar40 & auVar29);
  auVar5 = packssdw(auVar56,auVar5);
  if ((((p_Var1 != d68020_unpk_rr && p_Var1 != d68020_tst_i_32) &&
       (((((((((auVar5 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar5 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar5 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar5 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf]) &&
       p_Var1 != d68020_tst_pcix_32)) && p_Var1 != d68020_unpk_mm) &&
      ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                    (auVar20 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar20 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar20 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar20 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar20 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar20 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar20 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar20 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar20 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar20 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar20 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar20 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar20 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar20 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar20[0xf])) {
switchD_003f98d3_caseD_3:
    if (((((p_Var1 != d68040_move16_al_ai) && (p_Var1 != d68040_move16_ai_al)) &&
         (p_Var1 != d68040_move16_al_pi)) &&
        ((p_Var1 != d68040_move16_pi_al && (p_Var1 != d68040_move16_pi_pi)))) &&
       ((p_Var1 != d68040_cinv && (p_Var1 != d68040_cpush)))) {
switchD_003f98d3_caseD_7:
      auVar54._0_4_ = -(uint)(iVar3 == 0x3fbbae);
      auVar54._4_4_ = -(uint)(iVar6 == 0);
      auVar54._8_4_ = -(uint)(iVar3 == 0x3fbc43);
      auVar54._12_4_ = -(uint)(iVar6 == 0);
      auVar15._4_4_ = auVar54._0_4_;
      auVar15._0_4_ = auVar54._4_4_;
      auVar15._8_4_ = auVar54._12_4_;
      auVar15._12_4_ = auVar54._8_4_;
      auVar44._0_4_ = -(uint)(iVar3 == 0x3fbab4);
      auVar44._4_4_ = -(uint)(iVar6 == 0);
      auVar44._8_4_ = -(uint)(iVar3 == 0x3fbb31);
      auVar44._12_4_ = -(uint)(iVar6 == 0);
      auVar55._4_4_ = auVar44._0_4_;
      auVar55._0_4_ = auVar44._4_4_;
      auVar55._8_4_ = auVar44._12_4_;
      auVar55._12_4_ = auVar44._8_4_;
      auVar56 = packssdw(auVar55 & auVar44,auVar15 & auVar54);
      auVar31._0_4_ = -(uint)(iVar3 == 0x3fb94d);
      auVar31._4_4_ = -(uint)(iVar6 == 0);
      auVar31._8_4_ = -(uint)(iVar3 == 0x3fba29);
      auVar31._12_4_ = -(uint)(iVar6 == 0);
      auVar16._4_4_ = auVar31._0_4_;
      auVar16._0_4_ = auVar31._4_4_;
      auVar16._8_4_ = auVar31._12_4_;
      auVar16._12_4_ = auVar31._8_4_;
      auVar7._0_4_ = -(uint)(iVar3 == 0x3fb7d2);
      auVar7._4_4_ = -(uint)(iVar6 == 0);
      auVar7._8_4_ = -(uint)(iVar3 == 0x3fb89e);
      auVar7._12_4_ = -(uint)(iVar6 == 0);
      auVar4._4_4_ = auVar7._0_4_;
      auVar4._0_4_ = auVar7._4_4_;
      auVar4._8_4_ = auVar7._12_4_;
      auVar4._12_4_ = auVar7._8_4_;
      auVar5 = packssdw(auVar4 & auVar7,auVar16 & auVar31);
      auVar5 = packssdw(auVar5,auVar56);
      if (((((((((((auVar5 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar5 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar5 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar5 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf])
           && (p_Var1 != d68020_cptrapcc_16)) && (p_Var1 != d68020_cptrapcc_32)) &&
         (p_Var1 != d68040_pflush)) {
        if (cpu_type - 5 < 0xfffffffe) {
switchD_003f98d3_default:
          if (p_Var1 == d68020_rtm || p_Var1 == d68020_callm) {
            return 0;
          }
        }
        uVar2 = 1;
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned int m68k_is_valid_instruction(unsigned int instruction, unsigned int cpu_type)
{
	if(!g_initialized)
	{
		build_opcode_table();
		g_initialized = 1;
	}

	instruction &= 0xffff;
	if(g_instruction_table[instruction] == d68000_illegal)
		return 0;

	switch(cpu_type)
	{
		case M68K_CPU_TYPE_68000:
			if(g_instruction_table[instruction] == d68010_bkpt)
				return 0;
			if(g_instruction_table[instruction] == d68010_move_fr_ccr)
				return 0;
			if(g_instruction_table[instruction] == d68010_movec)
				return 0;
			if(g_instruction_table[instruction] == d68010_moves_8)
				return 0;
			if(g_instruction_table[instruction] == d68010_moves_16)
				return 0;
			if(g_instruction_table[instruction] == d68010_moves_32)
				return 0;
			if(g_instruction_table[instruction] == d68010_rtd)
				return 0;
			// Fallthrough
		case M68K_CPU_TYPE_68010:
			if(g_instruction_table[instruction] == d68020_bcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfchg)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfclr)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfexts)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfextu)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfffo)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfins)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfset)
				return 0;
			if(g_instruction_table[instruction] == d68020_bftst)
				return 0;
			if(g_instruction_table[instruction] == d68020_bra_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_bsr_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_callm)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas2_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas2_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk2_cmp2_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk2_cmp2_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk2_cmp2_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcdi_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcix_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcdi_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcix_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcdi_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcix_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpbcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpbcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpdbcc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpgen)
				return 0;
			if(g_instruction_table[instruction] == d68020_cprestore)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpsave)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpscc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_0)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_divl)
				return 0;
			if(g_instruction_table[instruction] == d68020_extb_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_link_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_mull)
				return 0;
			if(g_instruction_table[instruction] == d68020_pack_rr)
				return 0;
			if(g_instruction_table[instruction] == d68020_pack_mm)
				return 0;
			if(g_instruction_table[instruction] == d68020_rtm)
				return 0;
			if(g_instruction_table[instruction] == d68020_trapcc_0)
				return 0;
			if(g_instruction_table[instruction] == d68020_trapcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_trapcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcdi_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcix_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_i_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_a_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcdi_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcix_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_i_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_a_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcdi_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcix_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_i_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_unpk_rr)
				return 0;
			if(g_instruction_table[instruction] == d68020_unpk_mm)
				return 0;
			// Fallthrough
		case M68K_CPU_TYPE_68EC020:
		case M68K_CPU_TYPE_68020:
		case M68K_CPU_TYPE_68030:
		case M68K_CPU_TYPE_68EC030:
			if(g_instruction_table[instruction] == d68040_cinv)
				return 0;
			if(g_instruction_table[instruction] == d68040_cpush)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_pi_pi)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_pi_al)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_al_pi)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_ai_al)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_al_ai)
				return 0;
			// Fallthrough
		case M68K_CPU_TYPE_68040:
		case M68K_CPU_TYPE_68EC040:
		case M68K_CPU_TYPE_68LC040:
			if(g_instruction_table[instruction] == d68020_cpbcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpbcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpdbcc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpgen)
				return 0;
			if(g_instruction_table[instruction] == d68020_cprestore)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpsave)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpscc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_0)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68040_pflush)
				return 0;
	}
	if(cpu_type != M68K_CPU_TYPE_68020 && cpu_type != M68K_CPU_TYPE_68EC020 &&
	  (g_instruction_table[instruction] == d68020_callm ||
	  g_instruction_table[instruction] == d68020_rtm))
		return 0;

	return 1;
}